

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

void duckdb_zstd::ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t *ms,BYTE *ip)

{
  BYTE *pBVar1;
  U32 *pUVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  U32 *pUVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  
  pBVar1 = (ms->window).base;
  uVar16 = (long)ip - (long)pBVar1;
  uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  uVar7 = ms->nextToUpdate;
  uVar21 = (ulong)uVar7;
  uVar14 = (uint)uVar16;
  uVar10 = uVar14 - uVar5;
  if (uVar14 - uVar7 <= uVar5) {
    uVar10 = uVar7;
  }
  uVar6 = (1 << ((byte)(ms->cParams).searchLog & 0x1f)) - 3;
  uVar5 = 0xff;
  if (uVar6 < 0xff) {
    uVar5 = uVar6;
  }
  cVar3 = (char)(ms->cParams).hashLog;
  bVar9 = cVar3 - 2;
  lVar8 = 1L << (bVar9 & 0x3f);
  uVar11 = 3 << (bVar9 & 0x1f);
  uVar23 = uVar14 - uVar11;
  if (uVar14 < uVar11 || uVar23 == 0) {
    uVar23 = uVar7;
  }
  pUVar2 = ms->hashTable;
  pUVar13 = ms->chainTable;
  if (uVar7 < uVar14) {
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        lVar19 = -0x30e4432345000000;
        break;
      case 6:
        lVar19 = -0x30e4432340650000;
        break;
      case 7:
        lVar19 = -0x30e44323405a9d00;
        break;
      case 8:
        uVar24 = *(long *)(pBVar1 + uVar21) * -0x30e44323485a9b9d;
        goto LAB_01276df4;
      default:
        uVar24 = (ulong)((uint)(*(int *)(pBVar1 + uVar21) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f));
        goto LAB_01276df9;
      }
      uVar24 = lVar19 * *(long *)(pBVar1 + uVar21);
LAB_01276df4:
      uVar24 = uVar24 >> (0x42U - cVar3 & 0x3f);
LAB_01276df9:
      if (uVar23 <= uVar21) {
        pUVar2[lVar8 + (ulong)((U32)uVar21 - uVar23)] = pUVar2[uVar24 & 0xffffffff];
      }
      pUVar2[uVar24 & 0xffffffff] = (U32)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar16 & 0xffffffff));
  }
  uVar11 = 1 << (bVar9 & 0x1f);
  uVar21 = (ulong)uVar11;
  iVar22 = uVar5 + (uVar5 == 0);
  uVar24 = 0;
  uVar7 = 0;
  do {
    uVar5 = pUVar2[uVar24];
    bVar25 = true;
    uVar15 = 0;
    if (uVar23 <= uVar5) {
      uVar17 = 0;
      do {
        uVar15 = uVar15 + (uVar5 < uVar10);
        uVar20 = uVar17 + 1;
        uVar5 = pUVar2[lVar8 + (ulong)(uVar5 - uVar23)];
        if (uVar5 < uVar23) break;
        bVar25 = uVar17 < 2;
        uVar17 = uVar20;
      } while (bVar25);
      bVar25 = uVar20 != 3 || uVar6 == 0;
    }
    iVar18 = 0;
    if (!bVar25) {
      iVar18 = 0;
      uVar17 = uVar7;
      do {
        uVar7 = uVar17;
        if ((uVar5 < uVar10) && ((uVar5 == 0 || (uVar15 = uVar15 + 1, 3 < uVar15))))
        goto LAB_01276ed4;
        pUVar13[uVar7] = uVar5;
        iVar18 = iVar18 + 1;
        iVar4 = iVar18;
        if (uVar5 < uVar23) break;
        uVar5 = pUVar2[lVar8 + (ulong)(uVar5 - uVar23)];
        uVar17 = uVar7 + 1;
        iVar4 = iVar22;
      } while (iVar22 != iVar18);
      iVar18 = iVar4;
      uVar7 = uVar7 + 1;
    }
LAB_01276ed4:
    UVar12 = uVar7 * 0x100 + iVar18 * -0xff;
    if (iVar18 == 0) {
      UVar12 = 0;
    }
    pUVar2[uVar24] = UVar12;
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar21);
  uVar7 = 4 << (bVar9 & 0x1f);
  pUVar13 = pUVar2 + (uVar11 - 1);
  uVar10 = uVar11 * 4 - 1;
  do {
    uVar7 = uVar7 - 4;
    UVar12 = *pUVar13;
    pUVar13 = pUVar13 + -1;
    uVar24 = (ulong)uVar10;
    uVar10 = uVar10 - 4;
    pUVar2[(ulong)uVar7 + 2] = 0;
    (pUVar2 + uVar7)[0] = 0;
    (pUVar2 + uVar7)[1] = 0;
    pUVar2[uVar24] = UVar12;
    uVar5 = (int)uVar21 - 1;
    uVar21 = (ulong)uVar5;
  } while (uVar5 != 0);
  uVar21 = (ulong)ms->nextToUpdate;
  if (ms->nextToUpdate < uVar14) {
    do {
      switch((ms->cParams).minMatch) {
      case 5:
        uVar24 = *(long *)(pBVar1 + uVar21) * -0x30e4432345000000;
        break;
      case 6:
        uVar24 = *(long *)(pBVar1 + uVar21) * -0x30e4432340650000;
        break;
      case 7:
        uVar24 = *(long *)(pBVar1 + uVar21) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar24 = *(long *)(pBVar1 + uVar21) * -0x30e44323485a9b9d;
        break;
      default:
        uVar7 = (uint)(*(int *)(pBVar1 + uVar21) * -0x61c8864f) >> (0x22U - cVar3 & 0x1f);
        goto LAB_01276ff4;
      }
      uVar7 = (uint)(uVar24 >> (0x42U - cVar3 & 0x3f));
LAB_01276ff4:
      uVar24 = (ulong)(uVar7 << 2);
      *(undefined8 *)(pUVar2 + uVar24 + 1) = *(undefined8 *)(pUVar2 + uVar24);
      pUVar2[uVar24] = (U32)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar21 < (uVar16 & 0xffffffff));
  }
  ms->nextToUpdate = uVar14;
  return;
}

Assistant:

void ZSTD_dedicatedDictSearch_lazy_loadDictionary(ZSTD_matchState_t* ms, const BYTE* const ip)
{
    const BYTE* const base = ms->window.base;
    U32 const target = (U32)(ip - base);
    U32* const hashTable = ms->hashTable;
    U32* const chainTable = ms->chainTable;
    U32 const chainSize = 1 << ms->cParams.chainLog;
    U32 idx = ms->nextToUpdate;
    U32 const minChain = chainSize < target - idx ? target - chainSize : idx;
    U32 const bucketSize = 1 << ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32 const cacheSize = bucketSize - 1;
    U32 const chainAttempts = (1 << ms->cParams.searchLog) - cacheSize;
    U32 const chainLimit = chainAttempts > 255 ? 255 : chainAttempts;

    /* We know the hashtable is oversized by a factor of `bucketSize`.
     * We are going to temporarily pretend `bucketSize == 1`, keeping only a
     * single entry. We will use the rest of the space to construct a temporary
     * chaintable.
     */
    U32 const hashLog = ms->cParams.hashLog - ZSTD_LAZY_DDSS_BUCKET_LOG;
    U32* const tmpHashTable = hashTable;
    U32* const tmpChainTable = hashTable + ((size_t)1 << hashLog);
    U32 const tmpChainSize = (U32)((1 << ZSTD_LAZY_DDSS_BUCKET_LOG) - 1) << hashLog;
    U32 const tmpMinChain = tmpChainSize < target ? target - tmpChainSize : idx;
    U32 hashIdx;

    assert(ms->cParams.chainLog <= 24);
    assert(ms->cParams.hashLog > ms->cParams.chainLog);
    assert(idx != 0);
    assert(tmpMinChain <= minChain);

    /* fill conventional hash table and conventional chain table */
    for ( ; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch);
        if (idx >= tmpMinChain) {
            tmpChainTable[idx - tmpMinChain] = hashTable[h];
        }
        tmpHashTable[h] = idx;
    }

    /* sort chains into ddss chain table */
    {
        U32 chainPos = 0;
        for (hashIdx = 0; hashIdx < (1U << hashLog); hashIdx++) {
            U32 count;
            U32 countBeyondMinChain = 0;
            U32 i = tmpHashTable[hashIdx];
            for (count = 0; i >= tmpMinChain && count < cacheSize; count++) {
                /* skip through the chain to the first position that won't be
                 * in the hash cache bucket */
                if (i < minChain) {
                    countBeyondMinChain++;
                }
                i = tmpChainTable[i - tmpMinChain];
            }
            if (count == cacheSize) {
                for (count = 0; count < chainLimit;) {
                    if (i < minChain) {
                        if (!i || ++countBeyondMinChain > cacheSize) {
                            /* only allow pulling `cacheSize` number of entries
                             * into the cache or chainTable beyond `minChain`,
                             * to replace the entries pulled out of the
                             * chainTable into the cache. This lets us reach
                             * back further without increasing the total number
                             * of entries in the chainTable, guaranteeing the
                             * DDSS chain table will fit into the space
                             * allocated for the regular one. */
                            break;
                        }
                    }
                    chainTable[chainPos++] = i;
                    count++;
                    if (i < tmpMinChain) {
                        break;
                    }
                    i = tmpChainTable[i - tmpMinChain];
                }
            } else {
                count = 0;
            }
            if (count) {
                tmpHashTable[hashIdx] = ((chainPos - count) << 8) + count;
            } else {
                tmpHashTable[hashIdx] = 0;
            }
        }
        assert(chainPos <= chainSize); /* I believe this is guaranteed... */
    }

    /* move chain pointers into the last entry of each hash bucket */
    for (hashIdx = (1 << hashLog); hashIdx; ) {
        U32 const bucketIdx = --hashIdx << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 const chainPackedPointer = tmpHashTable[hashIdx];
        U32 i;
        for (i = 0; i < cacheSize; i++) {
            hashTable[bucketIdx + i] = 0;
        }
        hashTable[bucketIdx + bucketSize - 1] = chainPackedPointer;
    }

    /* fill the buckets of the hash table */
    for (idx = ms->nextToUpdate; idx < target; idx++) {
        U32 const h = (U32)ZSTD_hashPtr(base + idx, hashLog, ms->cParams.minMatch)
                   << ZSTD_LAZY_DDSS_BUCKET_LOG;
        U32 i;
        /* Shift hash cache down 1. */
        for (i = cacheSize - 1; i; i--)
            hashTable[h + i] = hashTable[h + i - 1];
        hashTable[h] = idx;
    }

    ms->nextToUpdate = target;
}